

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotShadedEx<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>>
               (char *label_id,GetterXsYs<unsigned_int> *getter1,GetterXsYs<unsigned_int> *getter2)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  ImU32 col;
  ImDrawList *DrawList;
  int iVar3;
  int i;
  int iVar4;
  ImPlotPoint p2;
  ImPlotPoint p1;
  
  bVar2 = BeginItem(label_id,1);
  if (bVar2) {
    if (GImPlot->FitThisFrame == true) {
      iVar4 = 0;
      while( true ) {
        iVar3 = getter2->Count;
        if (getter1->Count < getter2->Count) {
          iVar3 = getter1->Count;
        }
        if (iVar3 <= iVar4) break;
        p1 = GetterXsYs<unsigned_int>::operator()(getter1,iVar4);
        p2 = GetterXsYs<unsigned_int>::operator()(getter2,iVar4);
        FitPoint(&p1);
        FitPoint(&p2);
        iVar4 = iVar4 + 1;
      }
    }
    pIVar1 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar1->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar1->NextItemData).Colors + 1);
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar4]) {
      case 0:
        p2.x._0_4_ = iVar4;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
                          *)&p1,getter1,getter2,(TransformerLinLin *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLinLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        p2.x._0_4_ = iVar4;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLin>
                          *)&p1,getter1,getter2,(TransformerLogLin *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLin>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        p2.x._0_4_ = iVar4;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>
                          *)&p1,getter1,getter2,(TransformerLinLog *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLog>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        p2.x._0_4_ = iVar4;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLog>
                          *)&p1,getter1,getter2,(TransformerLogLog *)&p2,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,ImPlot::GetterXsYs<unsigned_int>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLog>
                    *)&p1,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < ImMin(getter1.Count, getter2.Count); ++i) {
                ImPlotPoint p1 = getter1(i);
                ImPlotPoint p2 = getter2(i);
                FitPoint(p1);
                FitPoint(p2);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}